

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Execute<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::hugeint_t>>
               (ArgMinMaxState<duckdb::hugeint_t,_duckdb::hugeint_t> *state,hugeint_t x_data,
               hugeint_t y_data,AggregateBinaryInput *binary)

{
  bool bVar1;
  hugeint_t *in_RDX;
  hugeint_t *in_RSI;
  TemplatedValidityMask<unsigned_long> *in_RDI;
  undefined8 in_R8;
  hugeint_t *in_R9;
  ArgMinMaxState<duckdb::hugeint_t,_duckdb::hugeint_t> *unaff_retaddr;
  hugeint_t *in_stack_ffffffffffffffc8;
  undefined1 x_null;
  
  x_null = (undefined1)((ulong)in_R8 >> 0x38);
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_RDI,(idx_t)in_R9);
  if ((bVar1) &&
     (bVar1 = LessThan::Operation<duckdb::hugeint_t>(in_R9,in_stack_ffffffffffffffc8), bVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_RDI,(idx_t)in_R9);
    Assign<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::hugeint_t>>
              (unaff_retaddr,in_RDX,in_RSI,(bool)x_null);
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}